

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O0

void duckdb::MatchAndReplaceUserSetVariables
               (DialectOptions *original,DialectOptions *sniffed,string *error,bool found_date,
               bool found_timestamp)

{
  NewLineIdentifier *pNVar1;
  key_type *__k;
  byte in_CL;
  long in_RSI;
  byte in_R8B;
  allocator *this;
  allocator local_191;
  string local_190 [24];
  string *in_stack_fffffffffffffe88;
  undefined5 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  allocator in_stack_fffffffffffffe97;
  CSVOption<unsigned_long> *in_stack_fffffffffffffe98;
  CSVOption<unsigned_long> *in_stack_fffffffffffffea0;
  undefined5 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  allocator in_stack_fffffffffffffebf;
  string *in_stack_fffffffffffffec0;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec8;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffed0;
  allocator local_119;
  string local_118 [32];
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  CSVOption<duckdb::StrpTimeFormat> *in_stack_ffffffffffffff18;
  CSVOption<duckdb::StrpTimeFormat> *in_stack_ffffffffffffff20;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [38];
  byte local_1a;
  byte local_19;
  long local_10;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_10 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,"Header",&local_41);
  MatchAndReplace<bool>
            ((CSVOption<bool> *)in_stack_fffffffffffffea0,
             (CSVOption<bool> *)in_stack_fffffffffffffe98,
             (string *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
             in_stack_fffffffffffffe88);
  ::std::__cxx11::string::~string(local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pNVar1 = CSVOption<duckdb::NewLineIdentifier>::GetValue
                     ((CSVOption<duckdb::NewLineIdentifier> *)(local_10 + 0x2e));
  if (*pNVar1 != NOT_SET) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_78,"New Line",&local_79);
    MatchAndReplace<duckdb::NewLineIdentifier>
              ((CSVOption<duckdb::NewLineIdentifier> *)in_stack_fffffffffffffea0,
               (CSVOption<duckdb::NewLineIdentifier> *)in_stack_fffffffffffffe98,
               (string *)
               CONCAT17(in_stack_fffffffffffffe97,
                        CONCAT16(in_stack_fffffffffffffe96,
                                 CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
               in_stack_fffffffffffffe88);
    ::std::__cxx11::string::~string(local_78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_a0,"Skip Rows",&local_a1);
  MatchAndReplace<unsigned_long>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (string *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
             in_stack_fffffffffffffe88);
  ::std::__cxx11::string::~string(local_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_c8,"Delimiter",&local_c9);
  MatchAndReplace<std::__cxx11::string>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (string *)
             CONCAT17(in_stack_fffffffffffffebf,
                      CONCAT16(in_stack_fffffffffffffebe,
                               CONCAT15(in_stack_fffffffffffffebd,in_stack_fffffffffffffeb8))));
  ::std::__cxx11::string::~string(local_c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff10,"Quote",(allocator *)&stack0xffffffffffffff0f);
  MatchAndReplace<char>
            ((CSVOption<char> *)in_stack_fffffffffffffea0,
             (CSVOption<char> *)in_stack_fffffffffffffe98,
             (string *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
             in_stack_fffffffffffffe88);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_118,"Escape",&local_119);
  MatchAndReplace<char>
            ((CSVOption<char> *)in_stack_fffffffffffffea0,
             (CSVOption<char> *)in_stack_fffffffffffffe98,
             (string *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
             in_stack_fffffffffffffe88);
  ::std::__cxx11::string::~string(local_118);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
  __k = (key_type *)(local_10 + 0x2c);
  this = (allocator *)&stack0xfffffffffffffebf;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffec0,"Comment",this);
  MatchAndReplace<char>
            ((CSVOption<char> *)in_stack_fffffffffffffea0,
             (CSVOption<char> *)in_stack_fffffffffffffe98,
             (string *)
             CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,
                               CONCAT15(in_stack_fffffffffffffe95,in_stack_fffffffffffffe90))),
             in_stack_fffffffffffffe88);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
  if ((local_19 & 1) != 0) {
    ::std::
    map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
    ::operator[]((map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                  *)this,__k);
    ::std::
    map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
    ::operator[]((map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                  *)this,__k);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe98,"Date Format",
               (allocator *)&stack0xfffffffffffffe97);
    MatchAndReplace<duckdb::StrpTimeFormat>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe97);
  }
  if ((local_1a & 1) != 0) {
    ::std::
    map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
    ::operator[]((map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                  *)this,__k);
    ::std::
    map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
    ::operator[]((map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                  *)this,__k);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_190,"Timestamp Format",&local_191);
    MatchAndReplace<duckdb::StrpTimeFormat>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    ::std::__cxx11::string::~string(local_190);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  return;
}

Assistant:

void MatchAndReplaceUserSetVariables(DialectOptions &original, DialectOptions &sniffed, string &error, bool found_date,
                                     bool found_timestamp) {
	MatchAndReplace(original.header, sniffed.header, "Header", error);
	if (sniffed.state_machine_options.new_line.GetValue() != NewLineIdentifier::NOT_SET) {
		// Is sniffed line is not set (e.g., single-line file) , we don't try to replace and match.
		MatchAndReplace(original.state_machine_options.new_line, sniffed.state_machine_options.new_line, "New Line",
		                error);
	}
	MatchAndReplace(original.skip_rows, sniffed.skip_rows, "Skip Rows", error);
	MatchAndReplace(original.state_machine_options.delimiter, sniffed.state_machine_options.delimiter, "Delimiter",
	                error);
	MatchAndReplace(original.state_machine_options.quote, sniffed.state_machine_options.quote, "Quote", error);
	MatchAndReplace(original.state_machine_options.escape, sniffed.state_machine_options.escape, "Escape", error);
	MatchAndReplace(original.state_machine_options.comment, sniffed.state_machine_options.comment, "Comment", error);
	if (found_date) {
		MatchAndReplace(original.date_format[LogicalTypeId::DATE], sniffed.date_format[LogicalTypeId::DATE],
		                "Date Format", error);
	}
	if (found_timestamp) {
		MatchAndReplace(original.date_format[LogicalTypeId::TIMESTAMP], sniffed.date_format[LogicalTypeId::TIMESTAMP],
		                "Timestamp Format", error);
	}
}